

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O2

void __thiscall amrex::FArrayBox::FArrayBox(FArrayBox *this,Box *b,int ncomp,Arena *ar)

{
  BaseFab<double>::BaseFab(&this->super_BaseFab<double>,b,ncomp,ar);
  (this->super_BaseFab<double>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_007d2d38;
  *(undefined4 *)&(this->super_BaseFab<double>).field_0x44 = 0;
  initVal(this);
  return;
}

Assistant:

FArrayBox::FArrayBox (const Box& b, int ncomp, Arena* ar)
    : BaseFab<Real>(b,ncomp,ar)
{
    initVal();
}